

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_tests.cpp
# Opt level: O2

void __thiscall hash_tests::siphash::test_method(siphash *this)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  uint64_t k0;
  uint64_t k1;
  uint64_t uVar4;
  ulong uVar5;
  undefined1 *puVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator pvVar8;
  iterator in_R9;
  HashWriter *pHVar9;
  CMutableTransaction *pCVar10;
  CSipHasher *pCVar11;
  ulong uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  bool bVar14;
  const_string file;
  Span<const_unsigned_char> data;
  const_string file_00;
  Span<const_unsigned_char> data_00;
  const_string file_01;
  const_string file_02;
  Span<const_unsigned_char> data_01;
  const_string file_03;
  Span<const_unsigned_char> data_02;
  const_string file_04;
  Span<const_unsigned_char> data_03;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  Span<const_unsigned_char> data_04;
  const_string file_10;
  const_string file_11;
  Span<const_unsigned_char> data_05;
  Span<const_unsigned_char> data_06;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  uint64_t local_558;
  undefined1 local_550 [48];
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  CMutableTransaction tx;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  uint8_t nb [4];
  CSipHasher sip288;
  CSipHasher sip256;
  uint256 x;
  FastRandomContext ctx;
  HashWriter ss;
  CSipHasher hasher3;
  CSipHasher hasher2;
  CSipHasher hasher;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSipHasher::CSipHasher(&hasher,0x706050403020100,0xf0e0d0c0b0a0908);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x54;
  file.m_begin = (iterator)&local_260;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_270,msg);
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = anon_var_dwarf_7360e5;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_278 = "";
  ss.ctx.s._0_8_ = CSipHasher::Finalize(&hasher);
  pHVar9 = &ss;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x726fdb47dd0e0e31;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (&ctx,&local_280,0x54,1,2,pHVar9,"hasher.Finalize()",&tx,"0x726fdb47dd0e0e31ull");
  data.m_size = 1;
  data.m_data = (uchar *)"";
  CSipHasher::Write(&hasher,data);
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x57;
  file_00.m_begin = (iterator)&local_290;
  msg_00.m_end = (iterator)pHVar9;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2a0,
             msg_00);
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = anon_var_dwarf_7360e5;
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_2a8 = "";
  ss.ctx.s._0_8_ = CSipHasher::Finalize(&hasher);
  pHVar9 = &ss;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x74f839c593dc67fd;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (&ctx,&local_2b0,0x57,1,2,pHVar9,"hasher.Finalize()",&tx,"0x74f839c593dc67fdull");
  data_00.m_size = 7;
  data_00.m_data = "\x01\x02\x03\x04\x05\x06\a";
  CSipHasher::Write(&hasher,data_00);
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x5a;
  file_01.m_begin = (iterator)&local_2c0;
  msg_01.m_end = (iterator)pHVar9;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2d0,
             msg_01);
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = anon_var_dwarf_7360e5;
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_2d8 = "";
  ss.ctx.s._0_8_ = CSipHasher::Finalize(&hasher);
  pHVar9 = &ss;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x93f5f5799a932462;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (&ctx,&local_2e0,0x5a,1,2,pHVar9,"hasher.Finalize()",&tx,"0x93f5f5799a932462ull");
  CSipHasher::Write(&hasher,0xf0e0d0c0b0a0908);
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x5c;
  file_02.m_begin = (iterator)&local_2f0;
  msg_02.m_end = (iterator)pHVar9;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_300,
             msg_02);
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = anon_var_dwarf_7360e5;
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_308 = "";
  ss.ctx.s._0_8_ = CSipHasher::Finalize(&hasher);
  pHVar9 = &ss;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x3f2acc7f57c29bdb;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (&ctx,&local_310,0x5c,1,2,pHVar9,"hasher.Finalize()",&tx,"0x3f2acc7f57c29bdbull");
  data_01.m_size = 2;
  data_01.m_data = "\x10\x11";
  CSipHasher::Write(&hasher,data_01);
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x5f;
  file_03.m_begin = (iterator)&local_320;
  msg_03.m_end = (iterator)pHVar9;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_330,
             msg_03);
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = anon_var_dwarf_7360e5;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_338 = "";
  ss.ctx.s._0_8_ = CSipHasher::Finalize(&hasher);
  pHVar9 = &ss;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x4bc1b3f0968dd39c;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (&ctx,&local_340,0x5f,1,2,pHVar9,"hasher.Finalize()",&tx,"0x4bc1b3f0968dd39cull");
  data_02.m_size = 9;
  data_02.m_data = "\x12\x13\x14\x15\x16\x17\x18\x19\x1a";
  CSipHasher::Write(&hasher,data_02);
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x62;
  file_04.m_begin = (iterator)&local_350;
  msg_04.m_end = (iterator)pHVar9;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_360,
             msg_04);
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = anon_var_dwarf_7360e5;
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_368 = "";
  ss.ctx.s._0_8_ = CSipHasher::Finalize(&hasher);
  pHVar9 = &ss;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x2f2e6163076bcfad;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (&ctx,&local_370,0x62,1,2,pHVar9,"hasher.Finalize()",&tx,"0x2f2e6163076bcfadull");
  data_03.m_size = 5;
  data_03.m_data = "\x1b\x1c\x1d\x1e\x1f";
  CSipHasher::Write(&hasher,data_03);
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x65;
  file_05.m_begin = (iterator)&local_380;
  msg_05.m_end = (iterator)pHVar9;
  msg_05.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_390,
             msg_05);
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = anon_var_dwarf_7360e5;
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_398 = "";
  ss.ctx.s._0_8_ = CSipHasher::Finalize(&hasher);
  pHVar9 = &ss;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x7127512f72f27cce;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (&ctx,&local_3a0,0x65,1,2,pHVar9,"hasher.Finalize()",&tx,"0x7127512f72f27cceull");
  CSipHasher::Write(&hasher,0x2726252423222120);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x67;
  file_06.m_begin = (iterator)&local_3b0;
  msg_06.m_end = (iterator)pHVar9;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3c0,
             msg_06);
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = anon_var_dwarf_7360e5;
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_3c8 = "";
  ss.ctx.s._0_8_ = CSipHasher::Finalize(&hasher);
  pHVar9 = &ss;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0xe3ea96b5304a7d0;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (&ctx,&local_3d0,0x67,1,2,pHVar9,"hasher.Finalize()",&tx,"0x0e3ea96b5304a7d0ull");
  CSipHasher::Write(&hasher,0x2f2e2d2c2b2a2928);
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x69;
  file_07.m_begin = (iterator)&local_3e0;
  msg_07.m_end = (iterator)pHVar9;
  msg_07.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3f0,
             msg_07);
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = anon_var_dwarf_7360e5;
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_3f8 = "";
  ss.ctx.s._0_8_ = CSipHasher::Finalize(&hasher);
  pHVar9 = &ss;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0xe612a3cb9ecba951;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (&ctx,&local_400,0x69,1,2,pHVar9,"hasher.Finalize()",&tx,"0xe612a3cb9ecba951ull");
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x6b;
  file_08.m_begin = (iterator)&local_410;
  msg_08.m_end = (iterator)pHVar9;
  msg_08.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_420,
             msg_08);
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = anon_var_dwarf_7360e5;
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_428 = "";
  ss.ctx.s[0] = 0x3020100;
  ss.ctx.s[1] = 0x7060504;
  ss.ctx.s[2] = 0xb0a0908;
  ss.ctx.s[3] = 0xf0e0d0c;
  ss.ctx.s[4] = 0x13121110;
  ss.ctx.s[5] = 0x17161514;
  ss.ctx.s[6] = 0x1b1a1918;
  ss.ctx.s[7] = 0x1f1e1d1c;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)SipHashUint256(0x706050403020100,0xf0e0d0c0b0a0908,(uint256 *)&ss);
  pCVar10 = &tx;
  hasher2.v[0] = 0x7127512f72f27cce;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (&ctx,&local_430,0x6b);
  CSipHasher::CSipHasher(&hasher2,0x706050403020100,0xf0e0d0c0b0a0908);
  puVar6 = siphash_4_2_testvec;
  bVar2 = 0;
  while (tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
         _M_start = (pointer)CONCAT71(tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                      _M_impl.super__Vector_impl_data._M_start._1_7_,bVar2),
        bVar2 < 0x40) {
    local_440 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
    local_438 = "";
    local_450 = &boost::unit_test::basic_cstring<char_const>::null;
    local_448 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0x71;
    file_09.m_begin = (iterator)&local_440;
    msg_09.m_end = (iterator)pCVar10;
    msg_09.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_450,
               msg_09);
    ctx.super_RandomMixin<FastRandomContext>._8_8_ =
         ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
    ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
    ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
    ctx.rng.m_aligned.input._8_8_ = anon_var_dwarf_7360e5;
    local_460 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
    local_458 = "";
    ss.ctx.s._0_8_ = CSipHasher::Finalize(&hasher2);
    pvVar7 = (iterator)0x2;
    pCVar10 = (CMutableTransaction *)&ss;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&ctx,&local_460,0x71);
    data_04.m_size = 1;
    data_04.m_data = (uchar *)&tx;
    CSipHasher::Write(&hasher2,data_04);
    bVar2 = (char)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start + 1;
  }
  CSipHasher::CSipHasher(&hasher3,0x706050403020100,0xf0e0d0c0b0a0908);
  uVar5 = 0x3020100;
  uVar12 = 0;
  for (uVar13 = 0; uVar13 < 0x40; uVar13 = uVar13 + 8) {
    local_470 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
    local_468 = "";
    local_480 = &boost::unit_test::basic_cstring<char_const>::null;
    local_478 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x78;
    file_10.m_begin = (iterator)&local_470;
    msg_10.m_end = (iterator)pCVar10;
    msg_10.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_480,
               msg_10);
    ctx.super_RandomMixin<FastRandomContext>._8_8_ =
         ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
    ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
    ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
    ctx.rng.m_aligned.input._8_8_ = anon_var_dwarf_7360e5;
    local_490 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
    local_488 = "";
    ss.ctx.s._0_8_ = CSipHasher::Finalize(&hasher3);
    pvVar7 = (iterator)0x2;
    pCVar10 = (CMutableTransaction *)&ss;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&ctx,&local_490,0x78,1,2,pCVar10,"hasher3.Finalize()",puVar6,"siphash_4_2_testvec[x]"
              );
    CSipHasher::Write(&hasher3,uVar12 | uVar5 | uVar13 | 0x706050400000000);
    uVar12 = uVar12 + 0x800000000000000;
    uVar5 = uVar5 + 0x8080808080800;
    puVar6 = puVar6 + 0x40;
  }
  ss.ctx.buf[0x30] = '\0';
  ss.ctx.buf[0x31] = '\0';
  ss.ctx.buf[0x32] = '\0';
  ss.ctx.buf[0x33] = '\0';
  ss.ctx.buf[0x34] = '\0';
  ss.ctx.buf[0x35] = '\0';
  ss.ctx.buf[0x36] = '\0';
  ss.ctx.buf[0x37] = '\0';
  ss.ctx.buf[0x38] = '\0';
  ss.ctx.buf[0x39] = '\0';
  ss.ctx.buf[0x3a] = '\0';
  ss.ctx.buf[0x3b] = '\0';
  ss.ctx.buf[0x3c] = '\0';
  ss.ctx.buf[0x3d] = '\0';
  ss.ctx.buf[0x3e] = '\0';
  ss.ctx.buf[0x3f] = '\0';
  ss.ctx.buf[0x20] = '\0';
  ss.ctx.buf[0x21] = '\0';
  ss.ctx.buf[0x22] = '\0';
  ss.ctx.buf[0x23] = '\0';
  ss.ctx.buf[0x24] = '\0';
  ss.ctx.buf[0x25] = '\0';
  ss.ctx.buf[0x26] = '\0';
  ss.ctx.buf[0x27] = '\0';
  ss.ctx.buf[0x28] = '\0';
  ss.ctx.buf[0x29] = '\0';
  ss.ctx.buf[0x2a] = '\0';
  ss.ctx.buf[0x2b] = '\0';
  ss.ctx.buf[0x2c] = '\0';
  ss.ctx.buf[0x2d] = '\0';
  ss.ctx.buf[0x2e] = '\0';
  ss.ctx.buf[0x2f] = '\0';
  ss.ctx.buf[0x10] = '\0';
  ss.ctx.buf[0x11] = '\0';
  ss.ctx.buf[0x12] = '\0';
  ss.ctx.buf[0x13] = '\0';
  ss.ctx.buf[0x14] = '\0';
  ss.ctx.buf[0x15] = '\0';
  ss.ctx.buf[0x16] = '\0';
  ss.ctx.buf[0x17] = '\0';
  ss.ctx.buf[0x18] = '\0';
  ss.ctx.buf[0x19] = '\0';
  ss.ctx.buf[0x1a] = '\0';
  ss.ctx.buf[0x1b] = '\0';
  ss.ctx.buf[0x1c] = '\0';
  ss.ctx.buf[0x1d] = '\0';
  ss.ctx.buf[0x1e] = '\0';
  ss.ctx.buf[0x1f] = '\0';
  ss.ctx.buf[0] = '\0';
  ss.ctx.buf[1] = '\0';
  ss.ctx.buf[2] = '\0';
  ss.ctx.buf[3] = '\0';
  ss.ctx.buf[4] = '\0';
  ss.ctx.buf[5] = '\0';
  ss.ctx.buf[6] = '\0';
  ss.ctx.buf[7] = '\0';
  ss.ctx.buf[8] = '\0';
  ss.ctx.buf[9] = '\0';
  ss.ctx.buf[10] = '\0';
  ss.ctx.buf[0xb] = '\0';
  ss.ctx.buf[0xc] = '\0';
  ss.ctx.buf[0xd] = '\0';
  ss.ctx.buf[0xe] = '\0';
  ss.ctx.buf[0xf] = '\0';
  ss.ctx.s[4] = 0;
  ss.ctx.s[5] = 0;
  ss.ctx.s[6] = 0;
  ss.ctx.s[7] = 0;
  ss.ctx.s[0] = 0;
  ss.ctx.s[1] = 0;
  ss.ctx.s[2] = 0;
  ss.ctx.s[3] = 0;
  ss.ctx.bytes = 0;
  CSHA256::CSHA256(&ss.ctx);
  CMutableTransaction::CMutableTransaction(&tx);
  tx.version = 1;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&::TX_WITH_WITNESS;
  ctx.super_RandomMixin<FastRandomContext>._8_8_ = &tx;
  ParamsWrapper<TransactionSerParams,_CMutableTransaction>::Serialize<HashWriter>
            ((ParamsWrapper<TransactionSerParams,_CMutableTransaction> *)&ctx,(HashWriter *)&ss.ctx)
  ;
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x83;
  file_11.m_begin = (iterator)&local_4d8;
  msg_11.m_end = (iterator)pCVar10;
  msg_11.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_4e8,
             msg_11);
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011480b0;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = anon_var_dwarf_7360e5;
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
  local_4f0 = "";
  HashWriter::GetHash((uint256 *)&sip256,&ss);
  sip288.v[0] = SipHashUint256(1,2,(uint256 *)&sip256);
  pCVar11 = &sip288;
  x.super_base_blob<256U>.m_data._M_elems[0] = '5';
  x.super_base_blob<256U>.m_data._M_elems[1] = '\n';
  x.super_base_blob<256U>.m_data._M_elems[2] = '*';
  x.super_base_blob<256U>.m_data._M_elems[3] = '\f';
  x.super_base_blob<256U>.m_data._M_elems[4] = 0x98;
  x.super_base_blob<256U>.m_data._M_elems[5] = '\x1e';
  x.super_base_blob<256U>.m_data._M_elems[6] = 'u';
  x.super_base_blob<256U>.m_data._M_elems[7] = 'y';
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (&ctx,&local_4f8,0x83,1,2,pCVar11,"SipHashUint256(1, 2, ss.GetHash())",&x,
             "0x79751e980c2a0a35ULL");
  FastRandomContext::FastRandomContext(&ctx,false);
  iVar3 = 0x10;
  while( true ) {
    bVar14 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar14) break;
    k0 = FastRandomContext::rand64(&ctx);
    k1 = FastRandomContext::rand64(&ctx);
    RandomMixin<FastRandomContext>::rand256
              (&x,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.
                   super_RandomMixin<FastRandomContext>);
    uVar4 = RandomMixin<FastRandomContext>::randbits<32>(&ctx.super_RandomMixin<FastRandomContext>);
    nb = SUB84(uVar4,0);
    CSipHasher::CSipHasher(&sip256,k0,k1);
    data_05.m_size = 0x20;
    data_05.m_data = (uchar *)&x;
    CSipHasher::Write(&sip256,data_05);
    sip288.tmp = sip256.tmp;
    sip288.count = sip256.count;
    sip288._41_7_ = sip256._41_7_;
    sip288.v[2] = sip256.v[2];
    sip288.v[3] = sip256.v[3];
    sip288.v[0] = sip256.v[0];
    sip288.v[1] = sip256.v[1];
    data_06.m_size = 4;
    data_06.m_data = nb;
    CSipHasher::Write(&sip288,data_06);
    local_508 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
    local_500 = "";
    local_518 = &boost::unit_test::basic_cstring<char_const>::null;
    local_510 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0x92;
    file_12.m_begin = (iterator)&local_508;
    msg_12.m_end = (iterator)pCVar11;
    msg_12.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_518,
               msg_12);
    local_550[0x20] = 0;
    local_550._24_8_ = &PTR__lazy_ostream_011480b0;
    local_550._40_8_ = boost::unit_test::lazy_ostream::inst;
    local_520 = "";
    local_550._8_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp"
    ;
    local_550._16_8_ = "";
    local_550._0_8_ = SipHashUint256(k0,k1,&x);
    local_558 = CSipHasher::Finalize(&sip256);
    pvVar8 = (iterator)0x2;
    pvVar7 = local_550;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_550 + 0x18,local_550 + 8,0x92,1,2,pvVar7,"SipHashUint256(k1, k2, x)",&local_558
               ,"sip256.Finalize()");
    local_568 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
    local_560 = "";
    local_578 = &boost::unit_test::basic_cstring<char_const>::null;
    local_570 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x93;
    file_13.m_begin = (iterator)&local_568;
    msg_13.m_end = pvVar7;
    msg_13.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_578,
               msg_13);
    local_550[0x20] = 0;
    local_550._24_8_ = &PTR__lazy_ostream_011480b0;
    local_550._40_8_ = boost::unit_test::lazy_ostream::inst;
    local_520 = "";
    local_588 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/hash_tests.cpp";
    local_580 = "";
    local_550._0_8_ = SipHashUint256Extra(k0,k1,&x,(uint32_t)SUB84(uVar4,0));
    local_558 = CSipHasher::Finalize(&sip288);
    pvVar7 = (iterator)0x2;
    pCVar11 = (CSipHasher *)local_550;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_550 + 0x18,&local_588,0x93,1,2,pCVar11,"SipHashUint256Extra(k1, k2, x, n)",
               &local_558,"sip288.Finalize()");
  }
  ChaCha20::~ChaCha20(&ctx.rng);
  CMutableTransaction::~CMutableTransaction(&tx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(siphash)
{
    CSipHasher hasher(0x0706050403020100ULL, 0x0F0E0D0C0B0A0908ULL);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x726fdb47dd0e0e31ull);
    static const unsigned char t0[1] = {0};
    hasher.Write(t0);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x74f839c593dc67fdull);
    static const unsigned char t1[7] = {1,2,3,4,5,6,7};
    hasher.Write(t1);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x93f5f5799a932462ull);
    hasher.Write(0x0F0E0D0C0B0A0908ULL);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x3f2acc7f57c29bdbull);
    static const unsigned char t2[2] = {16,17};
    hasher.Write(t2);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x4bc1b3f0968dd39cull);
    static const unsigned char t3[9] = {18,19,20,21,22,23,24,25,26};
    hasher.Write(t3);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x2f2e6163076bcfadull);
    static const unsigned char t4[5] = {27,28,29,30,31};
    hasher.Write(t4);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x7127512f72f27cceull);
    hasher.Write(0x2726252423222120ULL);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x0e3ea96b5304a7d0ull);
    hasher.Write(0x2F2E2D2C2B2A2928ULL);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0xe612a3cb9ecba951ull);

    BOOST_CHECK_EQUAL(SipHashUint256(0x0706050403020100ULL, 0x0F0E0D0C0B0A0908ULL, uint256{"1f1e1d1c1b1a191817161514131211100f0e0d0c0b0a09080706050403020100"}), 0x7127512f72f27cceull);

    // Check test vectors from spec, one byte at a time
    CSipHasher hasher2(0x0706050403020100ULL, 0x0F0E0D0C0B0A0908ULL);
    for (uint8_t x=0; x<std::size(siphash_4_2_testvec); ++x)
    {
        BOOST_CHECK_EQUAL(hasher2.Finalize(), siphash_4_2_testvec[x]);
        hasher2.Write(Span{&x, 1});
    }
    // Check test vectors from spec, eight bytes at a time
    CSipHasher hasher3(0x0706050403020100ULL, 0x0F0E0D0C0B0A0908ULL);
    for (uint8_t x=0; x<std::size(siphash_4_2_testvec); x+=8)
    {
        BOOST_CHECK_EQUAL(hasher3.Finalize(), siphash_4_2_testvec[x]);
        hasher3.Write(uint64_t(x)|(uint64_t(x+1)<<8)|(uint64_t(x+2)<<16)|(uint64_t(x+3)<<24)|
                     (uint64_t(x+4)<<32)|(uint64_t(x+5)<<40)|(uint64_t(x+6)<<48)|(uint64_t(x+7)<<56));
    }

    HashWriter ss{};
    CMutableTransaction tx;
    // Note these tests were originally written with tx.version=1
    // and the test would be affected by default tx version bumps if not fixed.
    tx.version = 1;
    ss << TX_WITH_WITNESS(tx);
    BOOST_CHECK_EQUAL(SipHashUint256(1, 2, ss.GetHash()), 0x79751e980c2a0a35ULL);

    // Check consistency between CSipHasher and SipHashUint256[Extra].
    FastRandomContext ctx;
    for (int i = 0; i < 16; ++i) {
        uint64_t k1 = ctx.rand64();
        uint64_t k2 = ctx.rand64();
        uint256 x = m_rng.rand256();
        uint32_t n = ctx.rand32();
        uint8_t nb[4];
        WriteLE32(nb, n);
        CSipHasher sip256(k1, k2);
        sip256.Write(x);
        CSipHasher sip288 = sip256;
        sip288.Write(nb);
        BOOST_CHECK_EQUAL(SipHashUint256(k1, k2, x), sip256.Finalize());
        BOOST_CHECK_EQUAL(SipHashUint256Extra(k1, k2, x, n), sip288.Finalize());
    }
}